

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteVar(WatWriter *this,Var *var,NextChar next_char)

{
  string_view str;
  bool bVar1;
  char *pcVar2;
  string *this_00;
  int __c;
  Var *__s;
  NextChar next_char_local;
  Var *var_local;
  WatWriter *this_local;
  
  __s = var;
  bVar1 = Var::is_index(var);
  if (bVar1) {
    pcVar2 = Var::index(var,(char *)__s,__c);
    Writef(this,"%u",(ulong)pcVar2 & 0xffffffff);
    this->next_char_ = next_char;
  }
  else {
    this_00 = Var::name_abi_cxx11_(var);
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    WriteName(this,str,next_char);
  }
  return;
}

Assistant:

void WatWriter::WriteVar(const Var& var, NextChar next_char) {
  if (var.is_index()) {
    Writef("%" PRIindex, var.index());
    next_char_ = next_char;
  } else {
    WriteName(var.name(), next_char);
  }
}